

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

MIR_reg_t get_reload_hreg(gen_ctx_t gen_ctx,MIR_reg_t var,MIR_reg_t type,int out_p)

{
  long lVar1;
  int iVar2;
  ra_ctx *prVar3;
  uint uVar4;
  int iVar5;
  MIR_reg_t MVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  MIR_reg_t *pMVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar9 = (ulong)(out_p != 0);
  prVar3 = gen_ctx->ra_ctx;
  MVar6 = 0x188;
  lVar7 = 0x1e8;
  if (out_p == 0) {
    lVar7 = 0x188;
  }
  iVar2 = *(int *)((long)prVar3->in_reloads + uVar9 * 4 + -8);
  uVar8 = (ulong)iVar2;
  bVar14 = 0 < (long)uVar8;
  if ((long)uVar8 < 1) {
    uVar12 = 0;
  }
  else {
    uVar10 = type - 8;
    pMVar11 = (MIR_reg_t *)((long)prVar3->lr_gap_bitmaps + lVar7 + -0x38);
    uVar12 = 0;
    uVar13 = 1;
    do {
      if ((var != 0xffffffff) && (pMVar11[-1] == var)) {
        MVar6 = *pMVar11;
        break;
      }
      if (uVar12 == 0) {
        MVar6 = 10;
        if (uVar10 < 3) {
          MVar6 = *(MIR_reg_t *)(&DAT_001b3920 + (ulong)uVar10 * 4);
        }
        uVar4 = 1;
        if (*pMVar11 != MVar6) goto LAB_00172767;
      }
      else {
LAB_00172767:
        MVar6 = 0xb;
        if (uVar10 < 3) {
          MVar6 = *(MIR_reg_t *)(&DAT_001b392c + (ulong)uVar10 * 4);
        }
        uVar4 = uVar12;
        if (*pMVar11 == MVar6) {
          uVar4 = 2;
        }
      }
      uVar12 = uVar4;
      bVar14 = uVar13 < uVar8;
      pMVar11 = pMVar11 + 3;
      lVar1 = (1 - uVar8) + uVar13;
      uVar13 = uVar13 + 1;
    } while (lVar1 != 1);
  }
  if (!bVar14) {
    if (1 < uVar12) {
      __assert_fail("rld_num <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
    if (type == 10) {
      MVar6 = 0xffffffff;
    }
    else {
      if ((type == 9) || (type == 8)) {
        iVar5 = 0x19;
      }
      else {
        iVar5 = 0xb;
      }
      MVar6 = iVar5 - (uint)(uVar12 == 0);
    }
    *(int *)((long)prVar3->in_reloads + uVar9 * 4 + -8) = iVar2 + 1;
    if (7 < iVar2) {
      __assert_fail("rld_num < (2 * 4)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
    *(MIR_reg_t *)((long)prVar3->lr_gap_bitmaps + uVar8 * 0xc + lVar7 + -0x3c) = var;
    *(MIR_reg_t *)((long)prVar3->lr_gap_bitmaps + uVar8 * 0xc + lVar7 + -0x40) = type;
    *(MIR_reg_t *)((long)prVar3->lr_gap_bitmaps + uVar8 * 0xc + lVar7 + -0x38) = MVar6;
  }
  return MVar6;
}

Assistant:

static MIR_reg_t get_reload_hreg (gen_ctx_t gen_ctx, MIR_reg_t var, MIR_reg_t type, int out_p) {
  MIR_reg_t hr;
  insn_reload_t *reloads = out_p ? out_reloads : in_reloads;
  int rld_num = 0, *reloads_num = out_p ? &out_reloads_num : &in_reloads_num;

  for (int i = 0; i < *reloads_num; i++) {
    if (var != MIR_NON_VAR && reloads[i].var == var) return reloads[i].hreg;
    if (rld_num == 0 && reloads[i].hreg == get_temp_hard_reg (type, TRUE))
      rld_num = 1;
    else if (reloads[i].hreg == get_temp_hard_reg (type, FALSE))
      rld_num = 2;
  }
  gen_assert (rld_num <= 1);
  hr = get_temp_hard_reg (type, rld_num == 0);
  rld_num = (*reloads_num)++;
  gen_assert (rld_num < MAX_INSN_RELOADS);
  reloads[rld_num].var = var;
  reloads[rld_num].type = type;
  reloads[rld_num].hreg = hr;
  return hr;
}